

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::ArrayCpyExpr::~ArrayCpyExpr(ArrayCpyExpr *this)

{
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            (&this->lengthExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->valueExpr)
  ;
  return;
}

Assistant:

ArrayCpyExpr::~ArrayCpyExpr() {
}